

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derTBITDec(octet *val,size_t *len,octet *der,size_t count,u32 tag)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  byte *pbVar4;
  size_t l;
  u32 local_3c;
  size_t local_38;
  
  sVar2 = derTLDec(&local_3c,&local_38,der,count);
  if ((sVar2 == 0xffffffffffffffff) || (uVar1 = local_38 + sVar2, count < uVar1)) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    sVar3 = 0xffffffffffffffff;
    if ((local_38 != 0 && local_3c == tag) && uVar1 != 0xffffffffffffffff) {
      pbVar4 = der + sVar2;
      if ((*pbVar4 < 8) && (local_38 != 1 || *pbVar4 == 0)) {
        if (val != (octet *)0x0) {
          memMove(val,pbVar4 + 1,local_38 - 1);
        }
        sVar3 = uVar1;
        if (len != (size_t *)0x0) {
          *len = (local_38 * 8 - (ulong)*pbVar4) - 8;
        }
      }
    }
  }
  return sVar3;
}

Assistant:

size_t derTBITDec(octet* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// число битов дополнения больше 7?
	// биты дополнения в несуществующем октете?
	if (l < 1 || v[0] > 7 || v[0] != 0 && l == 1) 
		return SIZE_MAX;
	// возвратить строку
	if (val)
	{
		ASSERT(memIsValid(val, l - 1));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l - 1));
		memMove(val, v + 1, l - 1);
	}
	// возвратить битовую длину
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = (l - 1) * 8 - v[0];
	}
	return count;
}